

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCone.c
# Opt level: O0

void Opa_ManStop(Opa_Man_t *p)

{
  int iVar1;
  int local_14;
  int i;
  Opa_Man_t *p_local;
  
  Vec_IntFree(p->vFront);
  for (local_14 = 0; iVar1 = Gia_ManPoNum(p->pGia), local_14 < iVar1; local_14 = local_14 + 1) {
    if (p->pvParts[local_14].pArray != (int *)0x0) {
      free(p->pvParts[local_14].pArray);
      p->pvParts[local_14].pArray = (int *)0x0;
    }
  }
  if (p->pvParts != (Vec_Int_t *)0x0) {
    free(p->pvParts);
    p->pvParts = (Vec_Int_t *)0x0;
  }
  if (p->pId2Part != (int *)0x0) {
    free(p->pId2Part);
    p->pId2Part = (int *)0x0;
  }
  if (p != (Opa_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

static inline void Opa_ManStop( Opa_Man_t * p )
{
    int i;
    Vec_IntFree( p->vFront );
    for ( i = 0; i < Gia_ManPoNum(p->pGia); i++ )
        ABC_FREE( p->pvParts[i].pArray );
    ABC_FREE( p->pvParts );
    ABC_FREE( p->pId2Part );
    ABC_FREE( p );
}